

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function_relation.cpp
# Opt level: O0

void __thiscall
duckdb::TableFunctionRelation::TableFunctionRelation
          (TableFunctionRelation *this,shared_ptr<duckdb::ClientContext,_true> *context,
          string *name_p,vector<duckdb::Value,_true> *parameters_p,
          named_parameter_map_t *named_parameters,
          shared_ptr<duckdb::Relation,_true> *input_relation_p,bool auto_init)

{
  string *in_RDX;
  undefined8 *in_RDI;
  shared_ptr<duckdb::ClientContext,_true> *in_R9;
  byte in_stack_00000008;
  TableFunctionRelation *this_00;
  Relation *in_stack_ffffffffffffffb0;
  
  Relation::Relation(in_stack_ffffffffffffffb0,in_R9,(RelationType)((ulong)in_RDI >> 0x38));
  *in_RDI = &PTR__TableFunctionRelation_035332b8;
  this_00 = (TableFunctionRelation *)(in_RDI + 0xd);
  ::std::__cxx11::string::string((string *)this_00,in_RDX);
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)this_00,(vector<duckdb::Value,_true> *)in_RDX);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                   *)this_00,
                  (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                   *)in_RDX);
  vector<duckdb::ColumnDefinition,_true>::vector
            ((vector<duckdb::ColumnDefinition,_true> *)0x195cf0e);
  shared_ptr<duckdb::Relation,_true>::shared_ptr
            ((shared_ptr<duckdb::Relation,_true> *)this_00,
             (shared_ptr<duckdb::Relation,_true> *)in_RDX);
  *(byte *)(in_RDI + 0x20) = in_stack_00000008 & 1;
  InitializeColumns(this_00);
  return;
}

Assistant:

TableFunctionRelation::TableFunctionRelation(const shared_ptr<ClientContext> &context, string name_p,
                                             vector<Value> parameters_p, named_parameter_map_t named_parameters,
                                             shared_ptr<Relation> input_relation_p, bool auto_init)
    : Relation(context, RelationType::TABLE_FUNCTION_RELATION), name(std::move(name_p)),
      parameters(std::move(parameters_p)), named_parameters(std::move(named_parameters)),
      input_relation(std::move(input_relation_p)), auto_initialize(auto_init) {
	InitializeColumns();
}